

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::fill_n<fmt::v8::appender,int,char>(appender out,int count,char *value)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = 0;
  if (0 < count) {
    iVar1 = count;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    buffer<char>::push_back
              ((buffer<char> *)
               out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,value);
  }
  return (appender)
         out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR auto fill_n(OutputIt out, Size count, const T& value)
    -> OutputIt {
  for (Size i = 0; i < count; ++i) *out++ = value;
  return out;
}